

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::addTestGroups
               (EglTestContext *eglTestCtx,TestCaseGroup *group,NativeType type)

{
  NativeType NVar1;
  bool bVar2;
  NativeCoordMappingCase *pNVar3;
  pointer pNVar4;
  char *pcVar5;
  char *pcVar6;
  reference pNVar7;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b2;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_70;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_68;
  iterator i;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  undefined1 local_38 [8];
  FilterList baseFilters;
  NativeType type_local;
  TestCaseGroup *group_local;
  EglTestContext *eglTestCtx_local;
  
  baseFilters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = type;
  eglu::FilterList::FilterList((FilterList *)local_38);
  if (baseFilters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == NATIVETYPE_WINDOW) {
    eglu::FilterList::operator<<((FilterList *)local_38,egl::(anonymous_namespace)::surfaceType<4u>)
    ;
  }
  else if (baseFilters.m_rules.
           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == NATIVETYPE_PIXMAP) {
    eglu::FilterList::operator<<((FilterList *)local_38,egl::(anonymous_namespace)::surfaceType<2u>)
    ;
  }
  else if (baseFilters.m_rules.
           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
           NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) {
    eglu::FilterList::operator<<((FilterList *)local_38,egl::(anonymous_namespace)::surfaceType<1u>)
    ;
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i,
             (FilterList *)local_38);
  local_68._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i);
  while( true ) {
    local_70._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i);
    bVar2 = __gnu_cxx::operator!=(&local_68,&local_70);
    if (!bVar2) break;
    pNVar3 = (NativeCoordMappingCase *)operator_new(0xc0);
    local_b2 = 1;
    pNVar4 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_68);
    pcVar5 = NamedFilterList::getName(pNVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar5,&local_b1);
    std::operator+(&local_90,&local_b0,"_clear");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pNVar4 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_68);
    pcVar6 = NamedFilterList::getDescription(pNVar4);
    NVar1 = baseFilters.m_rules.
            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator*(&local_68);
    NativeCoordMappingCase::NativeCoordMappingCase
              (pNVar3,eglTestCtx,pcVar5,pcVar6,false,NVar1,&pNVar7->super_FilterList);
    local_b2 = 0;
    tcu::TestNode::addChild((TestNode *)group,(TestNode *)pNVar3);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pNVar3 = (NativeCoordMappingCase *)operator_new(0xc0);
    pNVar4 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_68);
    pcVar5 = NamedFilterList::getName(pNVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar5,&local_f9);
    std::operator+(&local_d8,&local_f8,"_render");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pNVar4 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_68);
    pcVar6 = NamedFilterList::getDescription(pNVar4);
    NVar1 = baseFilters.m_rules.
            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator*(&local_68);
    NativeCoordMappingCase::NativeCoordMappingCase
              (pNVar3,eglTestCtx,pcVar5,pcVar6,true,NVar1,&pNVar7->super_FilterList);
    tcu::TestNode::addChild((TestNode *)group,(TestNode *)pNVar3);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_68,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  eglu::FilterList::~FilterList((FilterList *)local_38);
  return;
}

Assistant:

void addTestGroups (EglTestContext& eglTestCtx, TestCaseGroup* group, NativeCoordMappingCase::NativeType type)
{
	eglu::FilterList baseFilters;

	switch (type)
	{
		case NativeCoordMappingCase::NATIVETYPE_WINDOW:
			baseFilters << surfaceType<EGL_WINDOW_BIT>;
			break;

		case NativeCoordMappingCase::NATIVETYPE_PIXMAP:
			baseFilters << surfaceType<EGL_PIXMAP_BIT>;
			break;

		case NativeCoordMappingCase::NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
			baseFilters << surfaceType<EGL_PBUFFER_BIT>;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	vector<NamedFilterList> filterLists;
	getDefaultFilterLists(filterLists, baseFilters);

	for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
	{
		group->addChild(new NativeCoordMappingCase(eglTestCtx, (string(i->getName()) + "_clear").c_str(), i->getDescription(), false, type, *i));
		group->addChild(new NativeCoordMappingCase(eglTestCtx, (string(i->getName()) + "_render").c_str(), i->getDescription(), true, type, *i));
	}
}